

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_formats.c
# Opt level: O3

FMFieldList max_field_lists(FMFieldList list1,FMFieldList list2)

{
  FMFieldList p_Var1;
  undefined8 uVar2;
  size_t s;
  char **ppcVar3;
  int iVar4;
  long lVar5;
  undefined8 *__dest;
  FMFieldList p_Var6;
  char *pcVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  undefined8 *puVar16;
  size_t __nmemb;
  ulong uVar17;
  ulong local_60;
  
  lVar5 = -0x100000000;
  lVar15 = 1;
  lVar10 = -0x100000000;
  p_Var6 = list1;
  do {
    lVar10 = lVar10 + 0x100000000;
    lVar15 = lVar15 + -1;
    ppcVar3 = &p_Var6->field_name;
    p_Var6 = p_Var6 + 1;
  } while (*ppcVar3 != (char *)0x0);
  uVar14 = 0xffffffffffffffff;
  p_Var6 = list2;
  do {
    uVar14 = uVar14 + 1;
    lVar10 = lVar10 + 0x100000000;
    lVar5 = lVar5 + 0x100000000;
    ppcVar3 = &p_Var6->field_name;
    p_Var6 = p_Var6 + 1;
  } while (*ppcVar3 != (char *)0x0);
  s = (lVar5 >> 0x1d) * 3;
  __dest = (undefined8 *)ffs_malloc(s);
  memcpy(__dest,list2,s);
  p_Var6 = (FMFieldList)ffs_malloc((lVar10 >> 0x1d) * 3);
  iVar8 = (int)uVar14;
  if (lVar15 == 0) {
    local_60 = 0;
  }
  else {
    uVar9 = 1;
    if (1 < iVar8) {
      uVar9 = uVar14 & 0xffffffff;
    }
    local_60 = 1;
    if (1 < (int)-lVar15) {
      local_60 = -lVar15 & 0xffffffff;
    }
    uVar17 = 0;
    do {
      p_Var1 = list1 + uVar17;
      uVar12 = 0;
      if (uVar14 != 0) {
        uVar11 = 0;
        puVar16 = __dest;
        do {
          if (((char *)*puVar16 != (char *)0x0) &&
             (iVar4 = strcmp(p_Var1->field_name,(char *)*puVar16), uVar12 = uVar11, iVar4 == 0))
          break;
          uVar11 = uVar11 + 1;
          puVar16 = puVar16 + 3;
          uVar12 = uVar9;
        } while (uVar9 != uVar11);
      }
      if ((int)uVar12 == iVar8) {
        pcVar7 = strdup(p_Var1->field_name);
        p_Var6[uVar17].field_name = pcVar7;
        pcVar7 = strdup(p_Var1->field_type);
        p_Var6[uVar17].field_type = pcVar7;
        iVar4 = p_Var1->field_offset;
        p_Var6[uVar17].field_size = p_Var1->field_size;
        p_Var6[uVar17].field_offset = iVar4;
      }
      else {
        iVar4 = field_type_eq(p_Var1->field_type,(char *)__dest[(uVar12 & 0xffffffff) * 3 + 1]);
        if (iVar4 == 0) {
          free(__dest);
          free(p_Var6);
          return (FMFieldList)0x0;
        }
        pcVar7 = strdup(p_Var1->field_name);
        p_Var6[uVar17].field_name = pcVar7;
        pcVar7 = strdup(p_Var1->field_type);
        p_Var6[uVar17].field_type = pcVar7;
        iVar4 = *(int *)(__dest + (uVar12 & 0xffffffff) * 3 + 2);
        if (iVar4 < p_Var1->field_size) {
          iVar4 = p_Var1->field_size;
        }
        p_Var6[uVar17].field_size = iVar4;
        p_Var6[uVar17].field_offset = p_Var1->field_offset;
        __dest[(uVar12 & 0xffffffff) * 3] = 0;
      }
      uVar17 = uVar17 + 1;
    } while (uVar17 != local_60);
  }
  if (uVar14 == 0) {
    uVar13 = (uint)local_60;
  }
  else {
    uVar9 = 1;
    if (1 < iVar8) {
      uVar9 = uVar14 & 0xffffffff;
    }
    lVar5 = 0;
    do {
      if (*(char **)((long)__dest + lVar5) != (char *)0x0) {
        pcVar7 = strdup(*(char **)((long)__dest + lVar5));
        iVar8 = (int)local_60;
        p_Var6[iVar8].field_name = pcVar7;
        pcVar7 = strdup(*(char **)((long)__dest + lVar5 + 8));
        p_Var6[iVar8].field_type = pcVar7;
        uVar2 = *(undefined8 *)((long)__dest + lVar5 + 0x10);
        p_Var6[iVar8].field_size = (int)uVar2;
        p_Var6[iVar8].field_offset = (int)((ulong)uVar2 >> 0x20);
        local_60 = (ulong)(iVar8 + 1);
      }
      uVar13 = (uint)local_60;
      lVar5 = lVar5 + 0x18;
    } while (uVar9 * 0x18 != lVar5);
  }
  free(__dest);
  __nmemb = (size_t)(int)uVar13;
  p_Var6[__nmemb].field_name = (char *)0x0;
  p_Var6[__nmemb].field_type = (char *)0x0;
  p_Var6[__nmemb].field_size = 0;
  p_Var6[__nmemb].field_offset = 0;
  lVar5 = 0x18;
  qsort(p_Var6,__nmemb,0x18,field_offset_compar);
  if (1 < (int)uVar13) {
    do {
      iVar8 = *(int *)((long)p_Var6 + lVar5 + -8) + *(int *)((long)p_Var6 + lVar5 + -4);
      if (*(int *)((long)&p_Var6->field_offset + lVar5) < iVar8) {
        *(int *)((long)&p_Var6->field_offset + lVar5) = iVar8;
      }
      lVar5 = lVar5 + 0x18;
    } while ((ulong)uVar13 * 0x18 != lVar5);
  }
  return p_Var6;
}

Assistant:

extern
FMFieldList
max_field_lists(FMFieldList list1, FMFieldList list2)
{
    FMFieldList max_field_list = NULL;
    FMFieldList tlist2;
    int field_count1 = count_FMfield(list1);
    int field_count2 = count_FMfield(list2);
    int max_field_count = 0;
    int i, j;

    /* make a copy of list2 that we can scratch on */
    tlist2 = (FMFieldList) malloc((size_t) sizeof(FMField) * field_count2);
    memcpy(tlist2, list2, sizeof(FMField) * field_count2);

    max_field_list = (FMFieldList) malloc((size_t) sizeof(FMField) *
				      (field_count1 + field_count2 + 1));

    for (i = 0; i < field_count1; i++) {
	/* for each field in list1 */
	for (j = 0; j < field_count2; j++) {
	    if (tlist2[j].field_name &&
	      (strcmp(list1[i].field_name, tlist2[j].field_name) == 0)) {
		break;
	    }
	}
	if (j == field_count2) {
	    /* field exists only in 1, use it as is */
	    max_field_list[max_field_count].field_name =
		strdup(list1[i].field_name);
	    max_field_list[max_field_count].field_type =
		strdup(list1[i].field_type);
	    max_field_list[max_field_count].field_size =
		list1[i].field_size;
	    max_field_list[max_field_count].field_offset =
		list1[i].field_offset;
	    max_field_count++;
	} else {
	    /* field list in both.  Check types and take max size */
	    if (!field_type_eq(list1[i].field_type, tlist2[j].field_type)) {
		/* Yikes!  Types are bad!  Serious problem */
		free(tlist2);
		free(max_field_list);
		return NULL;
	    }
	    max_field_list[max_field_count].field_name =
		strdup(list1[i].field_name);
	    max_field_list[max_field_count].field_type =
		strdup(list1[i].field_type);
	    max_field_list[max_field_count].field_size =
		Max(list1[i].field_size, tlist2[j].field_size);
	    /* tentative offset */
	    max_field_list[max_field_count].field_offset =
		list1[i].field_offset;
	    max_field_count++;
	    /* mark field in list 2 as used */
	    tlist2[j].field_name = NULL;
	}
    }
    for (j = 0; j < field_count2; j++) {
	if (tlist2[j].field_name != NULL) {
	    /* didn't mark this field as used.  Must only be in list2 */
	    max_field_list[max_field_count].field_name =
		strdup(tlist2[j].field_name);
	    max_field_list[max_field_count].field_type =
		strdup(tlist2[j].field_type);
	    max_field_list[max_field_count].field_size =
		tlist2[j].field_size;
	    max_field_list[max_field_count].field_offset =
		tlist2[j].field_offset;
	    max_field_count++;
	}
    }
    free(tlist2);

    max_field_list[max_field_count].field_name = NULL;
    max_field_list[max_field_count].field_type = NULL;
    max_field_list[max_field_count].field_size = 0;
    max_field_list[max_field_count].field_offset = 0;

    /* sort the max list by offset now */
    qsort(max_field_list, max_field_count, sizeof(FMField),
	  field_offset_compar);
    for (i = 1; i < max_field_count; i++) {
	int last_field_end = max_field_list[i - 1].field_offset +
	max_field_list[i - 1].field_size;
	if (max_field_list[i].field_offset < last_field_end) {
	    /* damn, got some overlap.  Push this field up to fix. */
	    max_field_list[i].field_offset = last_field_end;
	}
    }
    return max_field_list;
}